

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t httplib::detail::write_headers(Stream *strm,Headers *headers)

{
  int iVar1;
  int extraout_var;
  ssize_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  long lVar3;
  __node_base *p_Var4;
  string s;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  p_Var4 = &(headers->_M_h)._M_before_begin;
  lVar3 = 0;
  while( true ) {
    p_Var4 = p_Var4->_M_nxt;
    if (p_Var4 == (__node_base *)0x0) {
      sVar2 = Stream::write(strm,0x222941,in_RDX,in_RCX);
      if (sVar2 < 0) {
        lVar3 = 0;
      }
      return lVar3 + sVar2;
    }
    local_50 = local_40;
    local_48 = 0;
    local_40[0] = 0;
    ::std::__cxx11::string::_M_assign((string *)&local_50);
    ::std::__cxx11::string::append((char *)&local_50);
    ::std::__cxx11::string::append((string *)&local_50);
    ::std::__cxx11::string::append((char *)&local_50);
    iVar1 = (*strm->_vptr_Stream[6])(strm,local_50,local_48);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (extraout_var < 0) break;
    lVar3 = lVar3 + CONCAT44(extraout_var,iVar1);
    in_RDX = extraout_RDX;
  }
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

inline ssize_t write_headers(Stream &strm, const Headers &headers) {
  ssize_t write_len = 0;
  for (const auto &x : headers) {
    std::string s;
    s = x.first;
    s += ": ";
    s += x.second;
    s += "\r\n";

    auto len = strm.write(s.data(), s.size());
    if (len < 0) { return len; }
    write_len += len;
  }
  auto len = strm.write("\r\n");
  if (len < 0) { return len; }
  write_len += len;
  return write_len;
}